

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashDefaultDeallocator(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  int local_2c;
  int n_key;
  xmlChar *key;
  int n_entry;
  void *entry;
  int mem_base;
  int test_ret;
  
  entry._4_4_ = 0;
  for (key._4_4_ = 0; (int)key._4_4_ < 2; key._4_4_ = key._4_4_ + 1) {
    for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_void_ptr(key._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_2c,1);
      xmlHashDefaultDeallocator(val,val_00);
      call_tests = call_tests + 1;
      des_void_ptr(key._4_4_,val,0);
      des_const_xmlChar_ptr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashDefaultDeallocator",(ulong)(uint)(iVar2 - iVar1));
        entry._4_4_ = entry._4_4_ + 1;
        printf(" %d",(ulong)key._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return entry._4_4_;
}

Assistant:

static int
test_xmlHashDefaultDeallocator(void) {
    int test_ret = 0;

    int mem_base;
    void * entry; /* hash table entry */
    int n_entry;
    const xmlChar * key; /* the entry's string key */
    int n_key;

    for (n_entry = 0;n_entry < gen_nb_void_ptr;n_entry++) {
    for (n_key = 0;n_key < gen_nb_const_xmlChar_ptr;n_key++) {
        mem_base = xmlMemBlocks();
        entry = gen_void_ptr(n_entry, 0);
        key = gen_const_xmlChar_ptr(n_key, 1);

        xmlHashDefaultDeallocator(entry, key);
        call_tests++;
        des_void_ptr(n_entry, entry, 0);
        des_const_xmlChar_ptr(n_key, key, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashDefaultDeallocator",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_entry);
            printf(" %d", n_key);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}